

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name.h
# Opt level: O3

void __thiscall
TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_>::DelKey
          (TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_> *this,FName *key)

{
  uint uVar1;
  IPair IVar2;
  Node *pNVar3;
  Node *n;
  Node *pNVar4;
  uint uVar5;
  
  uVar1 = key->Index;
  uVar5 = this->Size - 1 & uVar1;
  pNVar3 = this->Nodes[uVar5].Next;
  if (pNVar3 != (Node *)0x1) {
    pNVar4 = this->Nodes + uVar5;
    if ((pNVar4->Pair).Key.Index == uVar1) {
      if (pNVar3 != (Node *)0x0) {
        IVar2 = pNVar3->Pair;
        pNVar4->Next = pNVar3->Next;
        pNVar4->Pair = IVar2;
        pNVar4 = pNVar3;
      }
    }
    else {
      do {
        pNVar3 = pNVar4;
        pNVar4 = pNVar3->Next;
        if (pNVar4 == (Node *)0x0) {
          return;
        }
      } while ((pNVar4->Pair).Key.Index != uVar1);
      pNVar3->Next = pNVar4->Next;
    }
    pNVar4->Next = (Node *)0x1;
    this->NumUsed = this->NumUsed - 1;
  }
  return;
}

Assistant:

FName (const FName &other) { Index = other.Index; }